

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  char *pcVar1;
  stringpiece_ssize_type sVar2;
  iterator iVar3;
  ostream *poVar4;
  ulong uVar5;
  mapped_type *this_02;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  int iVar9;
  size_type pos;
  StringPiece x;
  StringPiece proto_file;
  StringPiece proto_file_list;
  StringPiece framework_name;
  key_type local_d0;
  key_type local_b0;
  StringPiece local_90;
  StringPiece local_80;
  char local_70;
  undefined7 uStack_6f;
  ulong local_60;
  StringPiece local_58;
  ulong local_48 [2];
  ulong local_38;
  
  sVar2 = StringPiece::find(line,':',0);
  local_38 = (ulong)(int)sVar2;
  local_60 = 0xffffffffffffffff;
  if (local_38 != 0xffffffffffffffff) {
    iVar9 = 0;
    StringPiece::StringPiece(&local_58,*line,0,local_38);
    StringPiece::StringPiece
              (&local_80,*line,(sVar2 << 0x20) + 0x100000000 >> 0x20,~local_38 + line->length_);
    StringPieceTrimWhitespace(&local_58);
    if (0 < local_80.length_) {
      pos = 0;
      do {
        sVar2 = StringPiece::find(&local_80,',',pos);
        if ((long)(int)sVar2 == local_60) {
          sVar2 = local_80.length_;
        }
        x.length_ = local_80.length_;
        x.ptr_ = local_80.ptr_;
        StringPiece::StringPiece(&local_90,x,pos,(long)((int)sVar2 - iVar9));
        StringPieceTrimWhitespace(&local_90);
        if (local_90.length_ != 0) {
          this_00 = &this->map_->_M_t;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if (local_90.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
          }
          iVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(this_00,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)iVar3._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header)
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: duplicate proto file reference, replacing framework entry for \'",
                       0x48);
            if (local_90.ptr_ == (char *)0x0) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
            }
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' with \'",8);
            if (local_58.ptr_ == (char *)0x0) {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              local_b0._M_string_length = 0;
              local_b0.field_2._M_allocated_capacity =
                   local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,local_58.ptr_,local_58.ptr_ + local_58.length_);
            }
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' (was \'",8);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,*(char **)(iVar3._M_node + 2),
                                (long)iVar3._M_node[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\').",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            std::ostream::flush();
          }
          uVar5 = StringPiece::find(&local_90,' ',0);
          if (uVar5 != local_60) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                       ,0x66);
            if (local_90.ptr_ == (char *)0x0) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
            }
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            std::ostream::flush();
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if (local_58.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_58.ptr_,local_58.ptr_ + local_58.length_);
          }
          this_01 = this->map_;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (local_90.ptr_ == (char *)0x0) {
            local_b0._M_string_length = 0;
            local_b0.field_2._M_allocated_capacity =
                 local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,local_90.ptr_,local_90.ptr_ + local_90.length_);
          }
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_01,&local_b0);
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        iVar9 = (int)sVar2 + 1;
        pos = (size_type)iVar9;
      } while ((long)pos < local_80.length_);
    }
    goto LAB_00234c3b;
  }
  local_58.ptr_ = (char *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Framework/proto file mapping line without colon sign: \'","");
  pcVar1 = line->ptr_;
  local_80.ptr_ = &local_70;
  if (pcVar1 == (char *)0x0) {
    local_80.length_ = 0;
    local_70 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,pcVar1,pcVar1 + line->length_);
  }
  uVar5 = 0xf;
  if ((ulong *)local_58.ptr_ != local_48) {
    uVar5 = local_48[0];
  }
  if (uVar5 < (ulong)(local_80.length_ + local_58.length_)) {
    uVar5 = 0xf;
    if (local_80.ptr_ != &local_70) {
      uVar5 = CONCAT71(uStack_6f,local_70);
    }
    if (uVar5 < (ulong)(local_80.length_ + local_58.length_)) goto LAB_00234b0b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_58.ptr_);
  }
  else {
LAB_00234b0b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80.ptr_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b0._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0.field_2._8_8_ = plVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_80.ptr_ != &local_70) {
    operator_delete(local_80.ptr_,CONCAT71(uStack_6f,local_70) + 1);
  }
  if ((ulong *)local_58.ptr_ != local_48) {
    operator_delete(local_58.ptr_,local_48[0] + 1);
  }
LAB_00234c3b:
  return local_38 != local_60;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece framework_name(line, 0, offset);
  StringPiece proto_file_list(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file(proto_file_list, start, offset - start);
    StringPieceTrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      map<string, string>::iterator existing_entry =
          map_->find(proto_file.ToString());
      if (existing_entry != map_->end()) {
        cerr << "warning: duplicate proto file reference, replacing framework entry for '"
             << proto_file.ToString() << "' with '" << framework_name.ToString()
             << "' (was '" << existing_entry->second << "')." << endl;
        cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        cerr << "note: framework mapping file had a proto file with a space in, hopefully that isn't a missing comma: '"
             << proto_file.ToString() << "'" << endl;
        cerr.flush();
      }

      (*map_)[proto_file.ToString()] = framework_name.ToString();
    }

    start = offset + 1;
  }

  return true;
}